

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

void __thiscall
CQueue::AddToQueue<void(*)(area_data*,std::__cxx11::string),area_data*&,char_const(&)[89]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_area_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,area_data **args,char (*args_1) [89])

{
  pointer pcVar1;
  area_data *paVar2;
  undefined8 *puVar3;
  string_view fmt;
  string_view fmt_00;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  int local_cc;
  vector<char_data_*,_std::allocator<char_data_*>_> local_c8;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<char_data_*,_std::allocator<char_data_*>_> local_68;
  _Any_data local_50;
  _Manager_type local_40;
  _Invoker_type p_Stack_38;
  
  local_cc = nTimer;
  if (nTimer < 0) {
    local_b0 = (undefined1  [8])0x2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_b0);
  }
  local_c8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0._0_4_ = nTimer;
  local_a8._M_p = (pointer)&local_98;
  pcVar1 = (from->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + from->_M_string_length);
  local_88._M_p = (pointer)&local_78;
  pcVar1 = (funcName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + funcName->_M_string_length);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_68,&local_c8);
  paVar2 = *args;
  local_40 = (_Manager_type)0x0;
  p_Stack_38 = (_Invoker_type)0x0;
  local_50._M_unused._M_object = (void *)0x0;
  local_50._8_8_ = 0;
  puVar3 = (undefined8 *)operator_new(0x70);
  *puVar3 = func;
  puVar3[1] = paVar2;
  memcpy(puVar3 + 2,args_1,0x59);
  p_Stack_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/queue.h:45:52)>
               ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/queue.h:45:52)>
             ::_M_manager;
  local_50._M_unused._M_object = puVar3;
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_b0);
  if (local_40 != (_Manager_type)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_68.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,funcName,&local_cc);
  if (local_c8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}